

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O3

void testBaseLimits(string *tempdir)

{
  ostream *poVar1;
  long *plVar2;
  char *in_RCX;
  int mxh;
  int mxw;
  float dcq;
  int local_14;
  int local_10;
  float local_c;
  
  exr_set_default_maximum_image_size(0x2a,0x2a);
  exr_get_default_maximum_image_size(&local_10,&local_14);
  if ((local_10 != 0x2a) || (local_14 != 0x2a)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to set_default_maximum_image_size: 42, 42 -> ",0x34);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x103,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0xffffffff,0xffffffff);
  exr_get_default_maximum_image_size(&local_10,&local_14);
  if ((local_10 != 0x2a) || (local_14 != 0x2a)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x10c,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0x54,0xffffffff);
  exr_get_default_maximum_image_size(&local_10,&local_14);
  if ((local_10 != 0x2a) || (local_14 != 0x2a)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x116,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_image_size(0xffffffff,0x54);
  exr_get_default_maximum_image_size(&local_10,&local_14);
  if ((local_10 != 0x2a) || (local_14 != 0x2a)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x120,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0x80,0x80);
  exr_get_default_maximum_tile_size(&local_10,&local_14);
  if ((local_10 != 0x80) || (local_14 != 0x80)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to set_default_maximum_tile_size: 128, 128 -> ",0x35);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x129,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0xffffffff,0xffffffff);
  exr_get_default_maximum_tile_size(&local_10,&local_14);
  if ((local_10 != 0x80) || (local_14 != 0x80)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x132,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0x54,0xffffffff);
  exr_get_default_maximum_tile_size(&local_10,&local_14);
  if ((local_10 != 0x80) || (local_14 != 0x80)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x13b,0x1812ad,in_RCX);
  }
  exr_set_default_maximum_tile_size(0xffffffff,0x54);
  exr_get_default_maximum_tile_size(&local_10,&local_14);
  if ((local_10 == 0x80) && (local_14 == 0x80)) {
    exr_set_default_maximum_image_size(0,0);
    exr_set_default_maximum_tile_size(0,0);
    exr_set_default_zip_compression_level(4);
    exr_get_default_zip_compression_level(&local_10);
    if (local_10 != 4) {
      core_test_fail("mxw == 4",(char *)0x14b,0x1812ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xffffffff);
    exr_get_default_zip_compression_level(&local_10);
    if (local_10 != -1) {
      core_test_fail("mxw == -1",(char *)0x14f,0x1812ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xfffffffe);
    exr_get_default_zip_compression_level(&local_10);
    if (local_10 != -1) {
      core_test_fail("mxw == -1",(char *)0x152,0x1812ad,in_RCX);
    }
    exr_set_default_zip_compression_level(0xf);
    exr_get_default_zip_compression_level(&local_10);
    if (local_10 == 9) {
      exr_set_default_zip_compression_level(0xffffffff);
      exr_set_default_dwa_compression_quality(0x41b80000);
      exr_get_default_dwa_compression_quality(&local_c);
      if ((local_c != 23.0) || (NAN(local_c))) {
        core_test_fail("dcq == 23.f",(char *)0x15c,0x1812ad,in_RCX);
      }
      exr_set_default_dwa_compression_quality(0xbf800000);
      exr_get_default_dwa_compression_quality(&local_c);
      if ((local_c == 0.0) && (!NAN(local_c))) {
        exr_set_default_dwa_compression_quality(0x43480000);
        exr_get_default_dwa_compression_quality(&local_c);
        if ((local_c == 100.0) && (!NAN(local_c))) {
          exr_set_default_dwa_compression_quality(0x42340000);
          return;
        }
        core_test_fail("dcq == 100.f",(char *)0x164,0x1812ad,in_RCX);
      }
      core_test_fail("dcq == 0.f",(char *)0x160,0x1812ad,in_RCX);
    }
    core_test_fail("mxw == 9",(char *)0x156,0x1812ad,in_RCX);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_14);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  core_test_fail("false",(char *)0x144,0x1812ad,in_RCX);
}

Assistant:

void
testBaseLimits (const std::string& tempdir)
{
    int mxw, mxh;
    exr_set_default_maximum_image_size (42, 42);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr << "Unable to set_default_maximum_image_size: 42, 42 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (-1, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (84, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (-1, 84);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_tile_size (128, 128);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr << "Unable to set_default_maximum_tile_size: 128, 128 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (84, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, 84);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (0, 0);
    exr_set_default_maximum_tile_size (0, 0);

    exr_set_default_zip_compression_level (4);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == 4);

    exr_set_default_zip_compression_level (-1);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == -1);
    exr_set_default_zip_compression_level (-2);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == -1);

    exr_set_default_zip_compression_level (15);
    exr_get_default_zip_compression_level (&mxw);
    EXRCORE_TEST (mxw == 9);
    exr_set_default_zip_compression_level (-1);

    float dcq;
    exr_set_default_dwa_compression_quality (23.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 23.f);

    exr_set_default_dwa_compression_quality (-1.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 0.f);

    exr_set_default_dwa_compression_quality (200.f);
    exr_get_default_dwa_compression_quality (&dcq);
    EXRCORE_TEST (dcq == 100.f);
    exr_set_default_dwa_compression_quality (45.f);
}